

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O2

int read_uword_val(Dwarf_Debug dbg,Dwarf_Small **ptr_in,Dwarf_Small *endptr,int errcode,
                  Dwarf_Unsigned *val_out,Dwarf_Unsigned area_length,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  Dwarf_Unsigned _ltmp;
  Dwarf_Unsigned *local_38;
  
  _ltmp = 0;
  pDVar1 = *ptr_in + 4;
  if (endptr < pDVar1) {
    _dwarf_error_string(dbg,error,0x14b,
                        "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
  }
  else {
    local_38 = val_out;
    (*dbg->de_copy_word)(&_ltmp,*ptr_in,4);
    if ((pDVar1 < endptr) && (_ltmp <= area_length)) {
      *local_38 = _ltmp;
      *ptr_in = pDVar1;
      return 0;
    }
    _dwarf_error(dbg,error,(ulong)(uint)errcode);
  }
  return 1;
}

Assistant:

static int
read_uword_val(Dwarf_Debug dbg,
    Dwarf_Small **ptr_in,
    Dwarf_Small *endptr,
    int   errcode,
    Dwarf_Unsigned *val_out,
    Dwarf_Unsigned area_length,
    Dwarf_Error *error)
{
    Dwarf_Unsigned val = 0;
    Dwarf_Small *ptr = *ptr_in;

    READ_UNALIGNED_CK(dbg, val, Dwarf_Unsigned,
        ptr, DWARF_32BIT_SIZE,
        error,endptr);
    ptr += DWARF_32BIT_SIZE;
    if (ptr >= endptr) {
        _dwarf_error(dbg, error,errcode);
        return DW_DLV_ERROR;
    }
    /*  Some of the fields are not length fields, but
        if non-zero the size will be longer than
        the value, so we do the following
        overall sanity check to avoid overflows. */
    if (val > area_length) {
        _dwarf_error(dbg, error,errcode);
        return DW_DLV_ERROR;
    }
    *val_out = val;
    *ptr_in = ptr;
    return DW_DLV_OK;
}